

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall leveldb::Version::~Version(Version *this)

{
  int iVar1;
  Version *pVVar2;
  Version *pVVar3;
  pointer ppFVar4;
  FileMetaData *this_00;
  uint __line;
  ulong uVar5;
  char *__assertion;
  long lVar6;
  
  if (this->refs_ != 0) {
    __assertion = "refs_ == 0";
    __line = 0x44;
LAB_001157dd:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,__line,"leveldb::Version::~Version()");
  }
  pVVar2 = this->next_;
  pVVar3 = this->prev_;
  pVVar3->next_ = pVVar2;
  pVVar2->prev_ = pVVar3;
  lVar6 = 0;
  do {
    if (lVar6 == 7) {
      lVar6 = 0xb0;
      do {
        std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
        ~_Vector_base((_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       *)((long)this->files_ + lVar6 + -0x20));
        lVar6 = lVar6 + -0x18;
      } while (lVar6 != 8);
      return;
    }
    for (uVar5 = 0;
        ppFVar4 = this->files_[lVar6].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)this->files_[lVar6].
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3);
        uVar5 = uVar5 + 1) {
      this_00 = ppFVar4[uVar5];
      iVar1 = this_00->refs;
      if (iVar1 < 1) {
        __assertion = "f->refs > 0";
        __line = 0x4e;
        goto LAB_001157dd;
      }
      this_00->refs = iVar1 + -1;
      if (iVar1 == 1) {
        FileMetaData::~FileMetaData(this_00);
        operator_delete(this_00);
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

Version::~Version() {
  assert(refs_ == 0);

  // Remove from linked list
  prev_->next_ = next_;
  next_->prev_ = prev_;

  // Drop references to files
  for (int level = 0; level < config::kNumLevels; level++) {
    for (size_t i = 0; i < files_[level].size(); i++) {
      FileMetaData* f = files_[level][i];
      assert(f->refs > 0);
      f->refs--;
      if (f->refs <= 0) {
        delete f;
      }
    }
  }
}